

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfAttribute.cpp
# Opt level: O3

bool __thiscall Imf_2_5::Attribute::knownType(Attribute *this,char *typeName)

{
  int iVar1;
  iterator iVar2;
  
  anon_unknown_0::typeMap();
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&anon_unknown_0::typeMap::tMap.mutex);
  if (iVar1 == 0) {
    iVar2 = std::
            map<const_char_*,_Imf_2_5::Attribute_*(*)(),_Imf_2_5::(anonymous_namespace)::NameCompare,_std::allocator<std::pair<const_char_*const,_Imf_2_5::Attribute_*(*)()>_>_>
            ::find((map<const_char_*,_Imf_2_5::Attribute_*(*)(),_Imf_2_5::(anonymous_namespace)::NameCompare,_std::allocator<std::pair<const_char_*const,_Imf_2_5::Attribute_*(*)()>_>_>
                    *)this,(key_type *)typeName);
    pthread_mutex_unlock((pthread_mutex_t *)&anon_unknown_0::typeMap::tMap.mutex);
    return (_Rb_tree_header *)iVar2._M_node !=
           &anon_unknown_0::typeMap::tMap.super_TypeMap._M_t._M_impl.super__Rb_tree_header;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

bool		
Attribute::knownType (const char typeName[])
{
    LockedTypeMap& tMap = typeMap();
    Lock lock (tMap.mutex);

    return tMap.find (typeName) != tMap.end();
}